

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cc
# Opt level: O3

void __thiscall FIX::double_conversion::Bignum::Align(Bignum *this,Bignum *other)

{
  int *piVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint *puVar6;
  bool bVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  
  iVar9 = this->exponent_;
  uVar3 = other->exponent_;
  uVar8 = iVar9 - uVar3;
  if (uVar8 != 0 && (int)uVar3 <= iVar9) {
    uVar4 = this->used_digits_;
    if (0x80 < (int)(uVar4 + uVar8)) {
      abort();
    }
    if (0 < (int)uVar4) {
      puVar6 = (this->bigits_).start_;
      uVar10 = (ulong)uVar4;
      do {
        iVar5 = (this->bigits_).length_;
        if ((long)iVar5 < (long)uVar10) goto LAB_0016ad23;
        uVar2 = (~uVar3 + iVar9) + uVar10;
        iVar11 = (int)uVar2;
        if ((iVar11 < 0) || (iVar5 <= iVar11)) goto LAB_0016ad23;
        puVar6[uVar2 & 0xffffffff] = puVar6[uVar10 - 1];
        bVar7 = 1 < uVar10;
        uVar10 = uVar10 - 1;
      } while (bVar7);
    }
    if (0 < (int)uVar8) {
      puVar6 = (this->bigits_).start_;
      uVar10 = 0;
      do {
        if ((long)(this->bigits_).length_ <= (long)uVar10) {
LAB_0016ad23:
          __assert_fail("0 <= index && index < length_",
                        "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/utils.h"
                        ,0xcc,
                        "T &FIX::double_conversion::Vector<unsigned int>::operator[](int) const [T = unsigned int]"
                       );
        }
        puVar6[uVar10] = 0;
        uVar10 = uVar10 + 1;
      } while (uVar8 != uVar10);
    }
    iVar9 = this->exponent_ - uVar8;
    piVar1 = &this->used_digits_;
    *piVar1 = *piVar1 + uVar8;
    this->exponent_ = iVar9;
    if (*piVar1 < 0) {
      __assert_fail("used_digits_ >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/bignum.cc"
                    ,0x2cc,"void FIX::double_conversion::Bignum::Align(const Bignum &)");
    }
    if (iVar9 < 0) {
      __assert_fail("exponent_ >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/bignum.cc"
                    ,0x2cd,"void FIX::double_conversion::Bignum::Align(const Bignum &)");
    }
  }
  return;
}

Assistant:

void Bignum::Align(const Bignum& other) {
  if (exponent_ > other.exponent_) {
    // If "X" represents a "hidden" digit (by the exponent) then we are in the
    // following case (a == this, b == other):
    // a:  aaaaaaXXXX   or a:   aaaaaXXX
    // b:     bbbbbbX      b: bbbbbbbbXX
    // We replace some of the hidden digits (X) of a with 0 digits.
    // a:  aaaaaa000X   or a:   aaaaa0XX
    int zero_digits = exponent_ - other.exponent_;
    EnsureCapacity(used_digits_ + zero_digits);
    for (int i = used_digits_ - 1; i >= 0; --i) {
      bigits_[i + zero_digits] = bigits_[i];
    }
    for (int i = 0; i < zero_digits; ++i) {
      bigits_[i] = 0;
    }
    used_digits_ += zero_digits;
    exponent_ -= zero_digits;
    ASSERT(used_digits_ >= 0);
    ASSERT(exponent_ >= 0);
  }
}